

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  int iVar1;
  undefined1 uVar2;
  int iVar3;
  ostream *poVar4;
  string *str;
  ostream *in_RDI;
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kIndent;
  TestPartResult *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  TestResult *in_stack_fffffffffffffe70;
  ostream *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  TestPartResult *local_40;
  int local_38;
  int local_34;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffe88);
  local_34 = 0;
  for (local_38 = 0; iVar1 = local_38, iVar3 = TestResult::total_part_count((TestResult *)0x19511a),
      iVar1 < iVar3; local_38 = local_38 + 1) {
    local_40 = TestResult::GetTestPartResult
                         (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20))
    ;
    uVar2 = TestPartResult::failed(in_stack_fffffffffffffe60);
    if ((bool)uVar2) {
      std::operator<<(local_8,",\n");
      local_34 = local_34 + 1;
      if (local_34 == 1) {
        in_stack_fffffffffffffef0 = std::operator<<(local_8,local_30);
        poVar4 = std::operator<<(in_stack_fffffffffffffef0,"\"");
        poVar4 = std::operator<<(poVar4,"failures");
        std::operator<<(poVar4,"\": [\n");
      }
      TestPartResult::file_name(in_stack_fffffffffffffe60);
      TestPartResult::line_number(local_40);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((char *)CONCAT17(uVar2,in_stack_fffffffffffffef8),
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
      str = (string *)TestPartResult::message((TestPartResult *)0x1952ab);
      std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      EscapeJson(str);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      poVar4 = std::operator<<(local_8,local_30);
      poVar4 = std::operator<<(poVar4,"  {\n");
      poVar4 = std::operator<<(poVar4,local_30);
      poVar4 = std::operator<<(poVar4,"    \"failure\": \"");
      poVar4 = std::operator<<(poVar4,local_90);
      poVar4 = std::operator<<(poVar4,"\",\n");
      poVar4 = std::operator<<(poVar4,local_30);
      in_stack_fffffffffffffe88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar4,"    \"type\": \"\"\n");
      in_stack_fffffffffffffe80 = std::operator<<((ostream *)in_stack_fffffffffffffe88,local_30);
      std::operator<<(in_stack_fffffffffffffe80,"  }");
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
    }
  }
  if (0 < local_34) {
    poVar4 = std::operator<<(local_8,"\n");
    poVar4 = std::operator<<(poVar4,local_30);
    std::operator<<(poVar4,"]");
  }
  poVar4 = std::operator<<(local_8,"\n");
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffe88);
  poVar4 = std::operator<<(poVar4,local_f0);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}